

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_hdr_remove(bcf_hdr_t *hdr,int type,char *key)

{
  char cVar1;
  uint uVar2;
  bcf_hrec_t **ppbVar3;
  uint *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  bcf_hrec_t *pbVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  
  uVar11 = (ulong)(uint)type;
  if (type == 3) {
    uVar11 = 0;
  }
  do {
    if ((uint)type < 4) {
      pbVar8 = bcf_hdr_get_hrec(hdr,type,"ID",key,(char *)0x0);
      if (pbVar8 == (bcf_hrec_t *)0x0) {
        return;
      }
      uVar9 = (ulong)hdr->nhrec;
      bVar19 = 0 < (long)uVar9;
      if ((long)uVar9 < 1) {
LAB_0011965b:
        __assert_fail("i<hdr->nhrec",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x269,"void bcf_hdr_remove(bcf_hdr_t *, int, const char *)");
      }
      if (*hdr->hrec == pbVar8) {
        uVar18 = 0;
      }
      else {
        uVar15 = 0;
        do {
          if (uVar9 - 1 == uVar15) goto LAB_0011965b;
          uVar18 = uVar15 + 1;
          lVar12 = uVar15 + 1;
          uVar15 = uVar18;
        } while (hdr->hrec[lVar12] != pbVar8);
        bVar19 = uVar18 < uVar9;
      }
      if (!bVar19) goto LAB_0011965b;
      puVar4 = (uint *)hdr->dict[type == 3];
      uVar7 = *puVar4;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        uVar17 = (uint)*key;
        if (*key == '\0') {
          uVar17 = 0;
        }
        else {
          cVar1 = key[1];
          pcVar16 = key + 2;
          while (cVar1 != '\0') {
            uVar17 = (int)cVar1 + uVar17 * 0x1f;
            cVar1 = *pcVar16;
            pcVar16 = pcVar16 + 1;
          }
        }
        uVar17 = uVar17 & uVar7 - 1;
        lVar12 = *(long *)(puVar4 + 4);
        iVar14 = 1;
        uVar13 = uVar17;
        do {
          uVar2 = *(uint *)(lVar12 + (ulong)(uVar13 >> 4) * 4);
          bVar10 = (char)uVar13 * '\x02' & 0x1e;
          uVar5 = uVar2 >> bVar10;
          if (((uVar5 & 2) != 0) ||
             (((uVar5 & 1) == 0 &&
              (iVar6 = strcmp(*(char **)(*(long *)(puVar4 + 6) + (ulong)uVar13 * 8),key), iVar6 == 0
              )))) {
            if ((uVar2 >> bVar10 & 3) == 0) {
              uVar7 = uVar13;
            }
            break;
          }
          uVar13 = uVar13 + iVar14 & uVar7 - 1;
          iVar14 = iVar14 + 1;
        } while (uVar13 != uVar17);
      }
      *(undefined8 *)((ulong)uVar7 * 0x30 + *(long *)(puVar4 + 8) + 0x10 + uVar11 * 8) = 0;
    }
    else {
      uVar7 = hdr->nhrec;
      if ((int)uVar7 < 1) {
        uVar18 = 0;
      }
      else {
        ppbVar3 = hdr->hrec;
        uVar18 = 0;
        do {
          pbVar8 = ppbVar3[uVar18];
          if (pbVar8->type == type) {
            if (type == 5) {
              pcVar16 = pbVar8->key;
            }
            else {
              uVar17 = bcf_hrec_find_key(pbVar8,"ID");
              if ((int)uVar17 < 0) goto LAB_001194a3;
              pcVar16 = pbVar8->vals[uVar17];
            }
            iVar14 = strcmp(pcVar16,key);
            if (iVar14 == 0) goto LAB_001194b7;
          }
LAB_001194a3:
          uVar18 = uVar18 + 1;
        } while (uVar7 != uVar18);
        uVar18 = (ulong)uVar7;
      }
LAB_001194b7:
      if ((uint)uVar18 == uVar7) {
        return;
      }
      pbVar8 = hdr->hrec[uVar18 & 0xffffffff];
    }
    lVar12 = (long)hdr->nhrec + -1;
    iVar14 = (int)lVar12;
    hdr->nhrec = iVar14;
    if ((int)uVar18 < iVar14) {
      memmove(hdr->hrec + (uVar18 & 0xffffffff),hdr->hrec + (uVar18 & 0xffffffff) + 1,
              (lVar12 - (int)uVar18) * 8);
    }
    bcf_hrec_destroy(pbVar8);
    hdr->dirty = 1;
  } while( true );
}

Assistant:

void bcf_hdr_remove(bcf_hdr_t *hdr, int type, const char *key)
{
    int i;
    bcf_hrec_t *hrec;
    while (1)
    {
        if ( type==BCF_HL_FLT || type==BCF_HL_INFO || type==BCF_HL_FMT || type== BCF_HL_CTG )
        {
            hrec = bcf_hdr_get_hrec(hdr, type, "ID", key, NULL);
            if ( !hrec ) return;

            for (i=0; i<hdr->nhrec; i++)
                if ( hdr->hrec[i]==hrec ) break;
            assert( i<hdr->nhrec );

            vdict_t *d = type==BCF_HL_CTG ? (vdict_t*)hdr->dict[BCF_DT_CTG] : (vdict_t*)hdr->dict[BCF_DT_ID];
            khint_t k = kh_get(vdict, d, key);
            kh_val(d, k).hrec[type==BCF_HL_CTG?0:type] = NULL;
        }
        else
        {
            for (i=0; i<hdr->nhrec; i++)
            {
                if ( hdr->hrec[i]->type!=type ) continue;
                if ( type==BCF_HL_GEN )
                {
                    if ( !strcmp(hdr->hrec[i]->key,key) ) break;
                }
                else
                {
                    // not all structured lines have ID, we could be more sophisticated as in bcf_hdr_get_hrec()
                    int j = bcf_hrec_find_key(hdr->hrec[i], "ID");
                    if ( j>=0 && !strcmp(hdr->hrec[i]->vals[j],key) ) break;
                }
            }
            if ( i==hdr->nhrec ) return;
            hrec = hdr->hrec[i];
        }

        hdr->nhrec--;
        if ( i < hdr->nhrec )
            memmove(&hdr->hrec[i],&hdr->hrec[i+1],(hdr->nhrec-i)*sizeof(bcf_hrec_t*));
        bcf_hrec_destroy(hrec);
        hdr->dirty = 1;
    }
}